

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkRevoluteTranslational::Initialize
          (ChLinkRevoluteTranslational *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,ChCoordsys<double> *csys,double distance)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  element_type *peVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar31;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ChBodyFrame *pCVar32;
  ChBodyFrame *pCVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double local_38;
  double local_30;
  double local_28;
  
  peVar22 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar33 = &peVar22->super_ChBodyFrame;
  if (peVar22 == (element_type *)0x0) {
    pCVar33 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar33;
  peVar22 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar32 = &peVar22->super_ChBodyFrame;
  if (peVar22 == (element_type *)0x0) {
    pCVar32 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar32;
  iVar30 = (*(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar31 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar30),
             (ChVariables *)CONCAT44(extraout_var_00,iVar31));
  iVar30 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar31 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar30),
             (ChVariables *)CONCAT44(extraout_var_02,iVar31));
  iVar30 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar31 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar30),
             (ChVariables *)CONCAT44(extraout_var_04,iVar31));
  iVar30 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  iVar31 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
             _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar30),
             (ChVariables *)CONCAT44(extraout_var_06,iVar31));
  dVar1 = (csys->rot).m_data[0];
  dVar37 = (csys->rot).m_data[1];
  dVar2 = (csys->rot).m_data[2];
  dVar3 = (csys->rot).m_data[3];
  pCVar33 = (this->super_ChLink).Body1;
  ChTransform<double>::TransformParentToLocal
            (&csys->pos,&(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
             &(pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
  if ((ChVector<double> *)&local_38 != &this->m_p1) {
    (this->m_p1).m_data[0] = local_38;
    (this->m_p1).m_data[1] = local_30;
    (this->m_p1).m_data[2] = local_28;
  }
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar3;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar1;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar3 * dVar3;
  auVar29 = vfmadd231sd_fma(auVar45,auVar67,auVar67);
  auVar50 = ZEXT816(0xbff0000000000000);
  auVar55 = ZEXT816(0x4000000000000000);
  auVar26 = vfmadd213sd_fma(auVar29,auVar55,auVar50);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = dVar37;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar2;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar1 * dVar37;
  auVar29 = vfmsub213sd_fma(auVar69,auVar68,auVar34);
  dVar23 = auVar29._0_8_ + auVar29._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar1 * dVar2;
  auVar29 = vfmadd213sd_fma(auVar69,auVar65,auVar42);
  dVar24 = auVar29._0_8_ + auVar29._0_8_;
  auVar29 = vfmadd231sd_fma(auVar34,auVar68,auVar69);
  dVar25 = auVar29._0_8_ + auVar29._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar2 * dVar2;
  auVar29 = vfmadd231sd_fma(auVar38,auVar67,auVar67);
  auVar27 = vfmadd213sd_fma(auVar29,auVar55,auVar50);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar1 * dVar3;
  auVar29 = vfmsub213sd_fma(auVar68,auVar65,auVar64);
  dVar1 = auVar29._0_8_ + auVar29._0_8_;
  auVar29 = vfmsub213sd_fma(auVar69,auVar65,auVar42);
  dVar2 = auVar29._0_8_ + auVar29._0_8_;
  auVar29 = vfmadd213sd_fma(auVar68,auVar65,auVar64);
  dVar3 = auVar29._0_8_ + auVar29._0_8_;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = dVar37 * dVar37;
  auVar29 = vfmadd231sd_fma(auVar66,auVar67,auVar67);
  auVar28 = vfmadd213sd_fma(auVar29,auVar55,auVar50);
  pCVar33 = (this->super_ChLink).Body1;
  pCVar32 = (this->super_ChLink).Body2;
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       dVar23 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar24;
  auVar29 = vfmadd231sd_fma(auVar51,auVar61,auVar29);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar29 = vfmadd231sd_fma(auVar29,auVar26,auVar50);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       dVar23 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar50 = vfmadd231sd_fma(auVar56,auVar61,auVar55);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar50 = vfmadd231sd_fma(auVar50,auVar26,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       dVar23 * (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = dVar24;
  auVar55 = vfmadd231sd_fma(auVar59,auVar62,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (pCVar33->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar55 = vfmadd231sd_fma(auVar55,auVar26,auVar6);
  (this->m_z1).m_data[0] = auVar55._0_8_;
  (this->m_z1).m_data[1] = auVar50._0_8_;
  (this->m_z1).m_data[2] = auVar29._0_8_;
  dVar37 = (distance * dVar2 + (csys->pos).m_data[2]) -
           (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  dVar23 = (auVar28._0_8_ * distance + (csys->pos).m_data[0]) -
           (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar24 = (dVar3 * distance + (csys->pos).m_data[1]) -
           (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar23;
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       dVar24 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar29 = vfmadd231sd_fma(auVar60,auVar52,auVar26);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = dVar37;
  auVar29 = vfmadd231sd_fma(auVar29,auVar46,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       dVar24 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar50 = vfmadd231sd_fma(auVar63,auVar52,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                 super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar50 = vfmadd231sd_fma(auVar50,auVar46,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar23;
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       dVar24 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar55 = vfmadd231sd_fma(auVar57,auVar53,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar37;
  auVar55 = vfmadd231sd_fma(auVar55,auVar47,auVar11);
  (this->m_p2).m_data[0] = auVar55._0_8_;
  (this->m_p2).m_data[1] = auVar50._0_8_;
  (this->m_p2).m_data[2] = auVar29._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       dVar3 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
  auVar29 = vfmadd231sd_fma(auVar48,auVar28,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar2;
  auVar29 = vfmadd231sd_fma(auVar29,auVar43,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       dVar3 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
  auVar50 = vfmadd231sd_fma(auVar54,auVar28,auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar50 = vfmadd231sd_fma(auVar50,auVar43,auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       dVar3 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
               super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [3];
  auVar55 = vfmadd231sd_fma(auVar58,auVar28,auVar16);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar55 = vfmadd231sd_fma(auVar55,auVar43,auVar28);
  (this->m_x2).m_data[0] = auVar55._0_8_;
  (this->m_x2).m_data[1] = auVar50._0_8_;
  (this->m_x2).m_data[2] = auVar29._0_8_;
  dVar37 = auVar27._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar1;
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       dVar37 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
  auVar29 = vfmadd231sd_fma(auVar44,auVar40,auVar27);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar25;
  auVar29 = vfmadd231sd_fma(auVar29,auVar35,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       dVar37 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar50 = vfmadd231sd_fma(auVar49,auVar40,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar50 = vfmadd231sd_fma(auVar50,auVar35,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       dVar37 * (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar1;
  auVar55 = vfmadd231sd_fma(auVar39,auVar41,auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       (pCVar32->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
       super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar25;
  auVar55 = vfmadd231sd_fma(auVar55,auVar36,auVar21);
  (this->m_y2).m_data[0] = auVar55._0_8_;
  (this->m_y2).m_data[1] = auVar50._0_8_;
  (this->m_y2).m_data[2] = auVar29._0_8_;
  this->m_dist = distance;
  this->m_cur_par1 = 0.0;
  this->m_cur_par2 = 0.0;
  this->m_cur_dot = 0.0;
  this->m_cur_dist = distance;
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Initialize(std::shared_ptr<ChBody> body1,
                                             std::shared_ptr<ChBody> body2,
                                             const ChCoordsys<>& csys,
                                             double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_par1.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_par2.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> x_axis = csys.rot.GetXaxis();
    ChVector<> y_axis = csys.rot.GetYaxis();
    ChVector<> z_axis = csys.rot.GetZaxis();

    m_p1 = Body1->TransformPointParentToLocal(csys.pos);
    m_z1 = Body1->TransformDirectionParentToLocal(z_axis);
    m_p2 = Body2->TransformPointParentToLocal(csys.pos + distance * x_axis);
    m_x2 = Body2->TransformDirectionParentToLocal(x_axis);
    m_y2 = Body2->TransformDirectionParentToLocal(y_axis);

    m_dist = distance;

    m_cur_par1 = 0;
    m_cur_par2 = 0;
    m_cur_dot = 0;
    m_cur_dist = distance;
}